

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

void __thiscall djb::tab_r::tab_r(tab_r *this,vector<float,_std::allocator<float>_> *ndf)

{
  impl local_20;
  vector<float,_std::allocator<float>_> *local_18;
  vector<float,_std::allocator<float>_> *ndf_local;
  tab_r *this_local;
  
  local_20._vptr_impl = (_func_int **)0x0;
  local_18 = ndf;
  ndf_local = (vector<float,_std::allocator<float>_> *)this;
  fresnel::ideal<1>::ideal((ideal<1> *)&local_20);
  radial::radial(&this->super_radial,&local_20);
  fresnel::ideal<1>::~ideal((ideal<1> *)&local_20);
  (this->super_radial).super_microfacet.super_brdf._vptr_brdf = (_func_int **)&PTR_eval_00276ce0;
  std::vector<float,_std::allocator<float>_>::vector(&this->m_ndf,local_18);
  std::vector<djb::vec2,_std::allocator<djb::vec2>_>::vector(&this->m_cdf);
  configure(this);
  return;
}

Assistant:

tab_r::tab_r(const std::vector<float_t> &ndf):
	radial(fresnel::ideal<1>()), m_ndf(ndf)
{
	configure();
}